

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetFilePrefix
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact)

{
  ArtifactType artifact_00;
  bool bVar1;
  string *psVar2;
  undefined1 local_a8 [8];
  string base;
  string suffix;
  allocator<char> local_51;
  string local_50;
  cmValue local_30;
  cmValue prefix_1;
  ArtifactType artifact_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  string *prefix;
  
  prefix_1.Value._4_4_ = artifact;
  bVar1 = IsImported(this);
  artifact_00 = prefix_1.Value._4_4_;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
    local_30 = GetFilePrefixInternal(this,config,artifact_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    bVar1 = cmValue::operator_cast_to_bool(&local_30);
    if (bVar1) {
      psVar2 = cmValue::operator*[abi_cxx11_(&local_30);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::string((string *)(base.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_a8);
    GetFullNameInternal(this,config,prefix_1.Value._4_4_,__return_storage_ptr__,(string *)local_a8,
                        (string *)(base.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)(base.field_2._M_local_buf + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFilePrefix(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  if (this->IsImported()) {
    cmValue prefix = this->GetFilePrefixInternal(config, artifact);
    return prefix ? *prefix : std::string();
  }

  std::string prefix;
  std::string suffix;
  std::string base;
  this->GetFullNameInternal(config, artifact, prefix, base, suffix);
  return prefix;
}